

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::add_extension(session_impl *this,ext_function_t *ext)

{
  undefined1 local_38 [32];
  ext_function_t *local_18;
  ext_function_t *ext_local;
  session_impl *this_local;
  
  local_18 = ext;
  ext_local = (ext_function_t *)this;
  ::std::
  make_shared<libtorrent::aux::session_impl::session_plugin_wrapper,std::function<std::shared_ptr<libtorrent::torrent_plugin>(libtorrent::torrent_handle_const&,libtorrent::client_data_t)>&>
            ((function<std::shared_ptr<libtorrent::torrent_plugin>_(const_libtorrent::torrent_handle_&,_libtorrent::client_data_t)>
              *)local_38);
  ::std::shared_ptr<libtorrent::plugin>::
  shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper,void>
            ((shared_ptr<libtorrent::plugin> *)(local_38 + 0x10),
             (shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper> *)local_38);
  add_ses_extension(this,(shared_ptr<libtorrent::plugin> *)(local_38 + 0x10));
  ::std::shared_ptr<libtorrent::plugin>::~shared_ptr
            ((shared_ptr<libtorrent::plugin> *)(local_38 + 0x10));
  ::std::shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper>::~shared_ptr
            ((shared_ptr<libtorrent::aux::session_impl::session_plugin_wrapper> *)local_38);
  return;
}

Assistant:

void session_impl::add_extension(ext_function_t ext)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(ext);

		add_ses_extension(std::make_shared<session_plugin_wrapper>(ext));
	}